

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O2

char * reader_func(lua_State *L,void *ud,size_t *size)

{
  uint uVar1;
  TValue *pTVar2;
  TValue *pTVar3;
  char *pcVar4;
  
  luaL_checkstack(L,2,"too many nested functions");
  pTVar2 = L->top;
  L->top = pTVar2 + 1;
  *pTVar2 = *L->base;
  lua_call(L,0,1);
  pTVar3 = L->top;
  pTVar2 = pTVar3 + -1;
  L->top = pTVar2;
  uVar1 = *(uint *)((long)pTVar3 + -4);
  if (uVar1 != 0xfffffffb) {
    if (uVar1 == 0xffffffff) {
      *size = 0;
      return (char *)0x0;
    }
    if (0xfffeffff < uVar1) {
      lj_err_caller(L,LJ_ERR_RDRSTR);
    }
  }
  L->base[4] = *pTVar2;
  pcVar4 = lua_tolstring(L,5,size);
  return pcVar4;
}

Assistant:

static const char *reader_func(lua_State *L, void *ud, size_t *size)
{
  UNUSED(ud);
  luaL_checkstack(L, 2, "too many nested functions");
  copyTV(L, L->top++, L->base);
  lua_call(L, 0, 1);  /* Call user-supplied function. */
  L->top--;
  if (tvisnil(L->top)) {
    *size = 0;
    return NULL;
  } else if (tvisstr(L->top) || tvisnumber(L->top)) {
    copyTV(L, L->base+4, L->top);  /* Anchor string in reserved stack slot. */
    return lua_tolstring(L, 5, size);
  } else {
    lj_err_caller(L, LJ_ERR_RDRSTR);
    return NULL;
  }
}